

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsConnectionReceiver::acceptAuthenticated(TlsConnectionReceiver *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  _func_int **local_1b0;
  Exception local_1a8;
  
  if (*(char *)(in_RSI + 0xb0) == '\x01') {
    Exception::Exception(&local_1a8,(Exception *)(in_RSI + 0xb8));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_1b0,&local_1a8);
    pp_Var1 = local_1b0;
    local_1b0 = (_func_int **)0x0;
    (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = pp_Var1;
    Exception::~Exception(&local_1a8);
  }
  else {
    ProducerConsumerQueue<kj::AuthenticatedStream>::pop
              ((ProducerConsumerQueue<kj::AuthenticatedStream> *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> acceptAuthenticated() override {
    KJ_IF_SOME(e, maybeInnerException) {
      // We've experienced an exception from the inner receiver, we consider this unrecoverable.
      return Exception(e);
    }

    return queue.pop();
  }